

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua-mysqlaux.c
# Opt level: O3

int quote_sql_str(lua_State *L)

{
  byte bVar1;
  int iVar2;
  size_t in_RAX;
  char *__src;
  char *s;
  size_t sVar3;
  uint n;
  uint uVar4;
  uint uVar5;
  size_t size;
  byte *pbVar6;
  byte *__dest;
  size_t len;
  size_t local_38;
  
  local_38 = in_RAX;
  iVar2 = lua_gettop(L);
  if (iVar2 != 1) {
    luaL_error(L,"expecting one argument");
  }
  __src = luaL_checklstring(L,1,&local_38);
  if (local_38 == 0) {
    lua_pushlstring(L,"\'\'",2);
  }
  else {
    sVar3 = 0;
    uVar4 = 0;
    do {
      if ((-1 < __src[sVar3]) &&
         (((uVar5 = (uint)(byte)__src[sVar3], uVar5 < 0x28 &&
           ((0x8404002701U >> ((ulong)uVar5 & 0x3f) & 1) != 0)) || (uVar5 == 0x5c)))) {
        uVar4 = uVar4 + 1;
      }
      sVar3 = sVar3 + 1;
    } while (local_38 != sVar3);
    size = local_38 + uVar4 + 2;
    s = (char *)lua_newuserdata(L,size);
    __dest = (byte *)(s + 1);
    *s = '\'';
    if (uVar4 == 0) {
      memcpy(__dest,__src,local_38);
      __dest = __dest + local_38;
    }
    else if (local_38 != 0) {
      sVar3 = 0;
      pbVar6 = __dest;
      do {
        bVar1 = __src[sVar3];
        __dest = pbVar6 + 1;
        if ((char)bVar1 < '\0') goto switchD_001172f8_caseD_b;
        if (0x19 < bVar1) {
          if (bVar1 < 0x27) {
            if (bVar1 == 0x1a) {
              pbVar6[0] = 0x5c;
              pbVar6[1] = 0x5a;
            }
            else {
              if (bVar1 != 0x22) goto switchD_001172f8_caseD_b;
              pbVar6[0] = 0x5c;
              pbVar6[1] = 0x22;
            }
          }
          else if (bVar1 == 0x27) {
            pbVar6[0] = 0x5c;
            pbVar6[1] = 0x27;
          }
          else {
            if (bVar1 != 0x5c) goto switchD_001172f8_caseD_b;
            pbVar6[0] = 0x5c;
            pbVar6[1] = 0x5c;
          }
          goto LAB_00117373;
        }
        switch(bVar1) {
        case 8:
          pbVar6[0] = 0x5c;
          pbVar6[1] = 0x62;
          break;
        case 9:
          pbVar6[0] = 0x5c;
          pbVar6[1] = 0x74;
          break;
        case 10:
          pbVar6[0] = 0x5c;
          pbVar6[1] = 0x6e;
          break;
        case 0xb:
        case 0xc:
switchD_001172f8_caseD_b:
          *pbVar6 = bVar1;
          goto LAB_0011737a;
        case 0xd:
          pbVar6[0] = 0x5c;
          pbVar6[1] = 0x72;
          break;
        default:
          if (bVar1 != 0) goto switchD_001172f8_caseD_b;
          pbVar6[0] = 0x5c;
          pbVar6[1] = 0x30;
        }
LAB_00117373:
        __dest = pbVar6 + 2;
LAB_0011737a:
        sVar3 = sVar3 + 1;
        pbVar6 = __dest;
      } while (local_38 != sVar3);
    }
    *__dest = 0x27;
    if (__dest + 1 != (byte *)(s + size)) {
      luaL_error(L,"quote sql string error");
    }
    lua_pushlstring(L,s,(long)(__dest + 1) - (long)s);
  }
  return 1;
}

Assistant:

static int
quote_sql_str(lua_State *L)
{
    size_t                   len, dlen, escape;
    unsigned char                  *p;
    unsigned char                  *src, *dst;
    
    if (lua_gettop(L) != 1) {
        return luaL_error(L, "expecting one argument");
    }
    
    src = (unsigned char *) luaL_checklstring(L, 1, &len);
    
    if (len == 0) {
        dst = (unsigned char *) "''";
        dlen = sizeof("''") - 1;
        lua_pushlstring(L, (char *) dst, dlen);
        return 1;
    }
    
    escape = num_escape_sql_str(NULL, src, len);
    
    dlen = sizeof("''") - 1 + len + escape;
    p = lua_newuserdata(L, dlen);
    
    dst = p;
    
    *p++ = '\'';
    
    if (escape == 0) {
        memcpy(p, src, len);
        p+=len;
    } else {
        p = (unsigned char *) escape_sql_str(p, src, len);
    }
    
    *p++ = '\'';
    
    if (p != dst + dlen) {
        return luaL_error(L, "quote sql string error");
    }
    
    lua_pushlstring(L, (char *) dst, p - dst);
    
    return 1;
}